

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall Game::Update(Game *this)

{
  float fVar1;
  float fVar2;
  int new_y_player2;
  int new_x_player2;
  int new_y;
  int new_x;
  Snake local_50;
  Game *local_10;
  Game *this_local;
  
  if ((((this->snake).alive & 1U) != 0) && (((this->snake2).alive & 1U) != 0)) {
    local_10 = this;
    Snake::Snake(&local_50,&this->snake2);
    Snake::Update(&this->snake,&local_50);
    Snake::~Snake(&local_50);
    Snake::Snake((Snake *)&new_y,&this->snake);
    Snake::Update(&this->snake2,(Snake *)&new_y);
    Snake::~Snake((Snake *)&new_y);
    fVar1 = (this->snake2).head_x;
    fVar2 = (this->snake2).head_y;
    if (((this->food).x == (int)(this->snake).head_x) &&
       ((this->food).y == (int)(this->snake).head_y)) {
      this->score = this->score + 1;
      PlaceFood(this);
      Snake::GrowBody(&this->snake);
      (this->snake).speed = (this->snake).speed + 0.02;
    }
    if (((this->food).x == (int)fVar1) && ((this->food).y == (int)fVar2)) {
      this->score = this->score + 1;
      PlaceFood(this);
      Snake::GrowBody(&this->snake2);
      (this->snake2).speed = (this->snake2).speed + 0.02;
    }
  }
  return;
}

Assistant:

void Game::Update() {
  if (!snake.alive || !snake2.alive) return;


  snake.Update(snake2);
  snake2.Update(snake);


  int new_x = static_cast<int>(snake.head_x);
  int new_y = static_cast<int>(snake.head_y);

  int new_x_player2 = static_cast<int>(snake2.head_x);
  int new_y_player2 = static_cast<int>(snake2.head_y);
  
  // Check if there's food over here
  if (food.x == new_x && food.y == new_y) {
    score++;
    PlaceFood();
    // Grow snake and increase speed.
    snake.GrowBody();
    snake.speed += 0.02;
  }
  
  if(food.x == new_x_player2 && food.y == new_y_player2)
  {
    score++;
    PlaceFood();
    // Grow snake and increase speed.
    snake2.GrowBody();
    snake2.speed += 0.02; 
  }
  
}